

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O2

Bmcs_Man_t * Bmcs_ManStart(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  Bmcs_Man_t *pBVar1;
  Gia_Man_t *p;
  satoko_t *s;
  long lVar2;
  int Lit;
  satoko_opts_t local_98;
  
  pBVar1 = (Bmcs_Man_t *)calloc(1,0x3a0);
  Lit = 1;
  satoko_default_opts(&local_98);
  local_98.conf_limit = (long)pPars->nConfLimit;
  if (0 < pGia->nRegs) {
    pBVar1->pPars = pPars;
    pBVar1->pGia = pGia;
    p = Gia_ManStart(pGia->nObjs * 3);
    pBVar1->pFrames = p;
    Gia_ManHashStart(p);
    Vec_PtrGrow(&pBVar1->vGia2Fr,1000);
    Vec_IntGrow(&pBVar1->vFr2Sat,pGia->vCis->nSize * 3);
    Vec_IntPush(&pBVar1->vFr2Sat,0);
    Vec_IntGrow(&pBVar1->vCiMap,pGia->vCis->nSize * 3);
    for (lVar2 = 0; lVar2 < pPars->nProcs; lVar2 = lVar2 + 1) {
      local_98.b_rst = (double)(int)lVar2 * -0.05;
      local_98.f_rst = local_98.b_rst + 0.8;
      local_98.b_rst = local_98.b_rst + 1.4;
      local_98.garbage_max_ratio = (float)((double)(int)lVar2 * 0.05 + 0.30000001192092896);
      s = satoko_create();
      pBVar1->pSats[lVar2] = s;
      satoko_configure(s,&local_98);
      satoko_add_variable(pBVar1->pSats[lVar2],'\0');
      satoko_add_clause(pBVar1->pSats[lVar2],&Lit,1);
      satoko_set_stop(pBVar1->pSats[lVar2],&pBVar1->fStopNow);
    }
    pBVar1->nSatVars = 1;
    return pBVar1;
  }
  __assert_fail("Gia_ManRegNum(pGia) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                ,0x174,"Bmcs_Man_t *Bmcs_ManStart(Gia_Man_t *, Bmc_AndPar_t *)");
}

Assistant:

Bmcs_Man_t * Bmcs_ManStart( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmcs_Man_t * p = ABC_CALLOC( Bmcs_Man_t, 1 ); 
    int i, Lit = Abc_Var2Lit( 0, 1 );
    satoko_opts_t opts;
    satoko_default_opts(&opts);
    opts.conf_limit = pPars->nConfLimit;
    assert( Gia_ManRegNum(pGia) > 0 );
    p->pPars   = pPars;
    p->pGia    = pGia;
    p->pFrames = Gia_ManStart( 3*Gia_ManObjNum(pGia) );  Gia_ManHashStart(p->pFrames);
    p->pClean  = NULL;
//    Vec_PtrFill( &p->vGia2Fr, Gia_ManCountTents(pGia)+1, NULL );
//    for ( i = 0; i < Vec_PtrSize(&p->vGia2Fr); i++ )
//        Vec_PtrWriteEntry( &p->vGia2Fr, i, ABC_FALLOC(int, Gia_ManObjNum(pGia)) );
    Vec_PtrGrow( &p->vGia2Fr, 1000 );  
    Vec_IntGrow( &p->vFr2Sat, 3*Gia_ManCiNum(pGia) );  
    Vec_IntPush( &p->vFr2Sat, 0 );
    Vec_IntGrow( &p->vCiMap, 3*Gia_ManCiNum(pGia) );
    for ( i = 0; i < pPars->nProcs; i++ )
    {
        // modify parameters to get different SAT solvers
        opts.f_rst = 0.8 - i * 0.05;
        opts.b_rst = 1.4 - i * 0.05;
        opts.garbage_max_ratio = (float) 0.3 + i * 0.05;
        // create SAT solvers
        p->pSats[i] = bmc_sat_solver_start( i );  
#ifdef ABC_USE_EXT_SOLVERS
        p->pSats[i]->SolverType = i;
#else
        satoko_configure(p->pSats[i], &opts);
#endif
        bmc_sat_solver_addvar( p->pSats[i] );
        bmc_sat_solver_addclause( p->pSats[i], &Lit, 1 );  
        bmc_sat_solver_setstop( p->pSats[i], &p->fStopNow );
    }
    p->nSatVars = 1;
    return p;
}